

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::
Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
Matcher(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *this,char *s)

{
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_69;
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  
  internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)0x169948);
  *(undefined ***)in_RDI = &PTR__Matcher_001c3660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,(char *)in_RSI,&local_69);
  Eq<std::__cxx11::string>(in_RDI);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffff98);
  operator=(in_RSI,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_RDI);
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)0x1699c4);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher((EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1699ce);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

Matcher<const internal::string&>::Matcher(const char* s) {
  *this = Eq(internal::string(s));
}